

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.cpp
# Opt level: O2

ostream * soplex::operator<<(ostream *os,SPxId *id)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  
  uVar1 = (id->super_DataKey).info;
  uVar2 = 1;
  if (uVar1 != 0) {
    uVar2 = (ulong)(~uVar1 >> 0x1e & 0xfffffffe);
  }
  std::operator<<(os,&DAT_002ce260 + *(int *)(&DAT_002ce260 + uVar2 * 4));
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,(id->super_DataKey).idx);
  poVar3 = std::operator<<(poVar3," (");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(id->super_DataKey).info);
  std::operator<<(poVar3,")");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SPxId& id)
{
   switch(id.type())
   {
   case SPxId::ROW_ID:
      os << "row ";
      break;

   case SPxId::COL_ID :
      os << "col ";
      break;

   case SPxId::INVALID :
      os << "Invalid ";
      break;

   default :
      throw SPxInternalCodeException("XSPXID01 This should never happen.");
   }

   os << id.idx << " (" << id.info << ")";

   return os;
}